

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O1

char __thiscall duckdb::Linenoise::Search(Linenoise *this,char c)

{
  pointer psVar1;
  int iVar2;
  EscapeSequence EVar3;
  long lVar4;
  ulong uVar5;
  char unaff_BPL;
  char cVar6;
  undefined7 in_register_00000031;
  bool bVar7;
  
  iVar2 = (int)CONCAT71(in_register_00000031,c);
  switch(iVar2) {
  case 1:
    AcceptSearch(this,'\x01');
    cVar6 = '\x01';
    break;
  case 2:
    AcceptSearch(this,'\x02');
    cVar6 = '\x02';
    break;
  case 3:
  case 7:
    CancelSearch(this);
    return '\0';
  case 4:
    AcceptSearch(this,'\x04');
    cVar6 = '\x04';
    break;
  case 5:
  case 9:
    AcceptSearch(this,'\x05');
    cVar6 = '\x05';
    break;
  case 6:
    AcceptSearch(this,'\x06');
    cVar6 = '\x06';
    break;
  case 8:
  case 0x17:
    goto switchD_00222223_caseD_8;
  case 10:
  case 0xd:
    AcceptSearch(this,'\r');
    cVar6 = '\r';
    break;
  case 0xb:
    AcceptSearch(this,'\v');
    cVar6 = '\v';
    break;
  case 0xc:
    linenoiseClearScreen();
    goto LAB_00222517;
  case 0xe:
  case 0x12:
  case 0x13:
    psVar1 = (this->search_matches).
             super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar5 = this->search_index + 1;
    this->search_index = uVar5;
    if ((ulong)(((long)psVar1 -
                 (long)(this->search_matches).
                       super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <=
        uVar5) {
      this->search_index = 0;
    }
    goto LAB_00222517;
  case 0xf:
  case 0x11:
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
switchD_00222223_caseD_f:
    ::std::__cxx11::string::push_back((char)this + 'h');
    goto LAB_002222fa;
  case 0x10:
    if (this->search_index == 0) {
      lVar4 = (long)(this->search_matches).
                    super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->search_matches).
                    super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      if (lVar4 != 0) {
        this->search_index = (lVar4 >> 3) * -0x5555555555555555 - 1;
      }
    }
    else {
      this->search_index = this->search_index - 1;
    }
    goto LAB_00222517;
  case 0x14:
    AcceptSearch(this,'\x14');
    cVar6 = '\x14';
    break;
  case 0x15:
    AcceptSearch(this,'\x15');
    cVar6 = '\x15';
    break;
  case 0x1b:
    EVar3 = Terminal::ReadEscapeSequence(this->ifd);
    bVar7 = false;
    switch(EVar3) {
    case HOME:
      AcceptSearch(this,'\x01');
      unaff_BPL = '\x01';
      goto LAB_0022246c;
    case END:
      AcceptSearch(this,'\x05');
      bVar7 = true;
      unaff_BPL = '\x05';
      break;
    case UP:
      if (this->search_index == 0) {
        lVar4 = (long)(this->search_matches).
                      super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->search_matches).
                      super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        if (lVar4 != 0) {
          this->search_index = (lVar4 >> 3) * -0x5555555555555555 - 1;
        }
      }
      else {
        this->search_index = this->search_index - 1;
      }
      goto LAB_00222511;
    case DOWN:
      psVar1 = (this->search_matches).
               super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>._M_impl
               .super__Vector_impl_data._M_finish;
      uVar5 = this->search_index + 1;
      this->search_index = uVar5;
      if ((ulong)(((long)psVar1 -
                   (long)(this->search_matches).
                         super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <=
          uVar5) {
        this->search_index = 0;
      }
LAB_00222511:
      bVar7 = false;
      break;
    case RIGHT:
      AcceptSearch(this,'\x06');
      bVar7 = true;
      unaff_BPL = '\x06';
      break;
    case LEFT:
      AcceptSearch(this,'\x02');
      bVar7 = true;
      unaff_BPL = '\x02';
      break;
    case ESCAPE:
      unaff_BPL = '\0';
      AcceptSearch(this,'\0');
LAB_0022246c:
      bVar7 = true;
    }
    if (bVar7) {
      return unaff_BPL;
    }
    goto LAB_00222517;
  default:
    if (iVar2 != 0x7f) goto switchD_00222223_caseD_f;
    goto switchD_00222223_caseD_8;
  }
  return cVar6;
switchD_00222223_caseD_8:
  bVar7 = (this->search_buf)._M_string_length != 0;
  if ((bVar7) && (bVar7)) {
    ::std::__cxx11::string::pop_back();
  }
LAB_002222fa:
  PerformSearch(this);
LAB_00222517:
  RefreshSearch(this);
  return '\0';
}

Assistant:

char Linenoise::Search(char c) {
	switch (c) {
	case CTRL_J:
	case ENTER: /* enter */
		// accept search and run
		return AcceptSearch(ENTER);
	case CTRL_R:
	case CTRL_S:
		// move to the next match index
		SearchNext();
		break;
	case ESC: /* escape sequence */ {
		auto escape = Terminal::ReadEscapeSequence(ifd);
		switch (escape) {
		case EscapeSequence::ESCAPE:
			// double escape accepts search without any additional command
			return AcceptSearch(0);
		case EscapeSequence::UP:
			SearchPrev();
			break;
		case EscapeSequence::DOWN:
			SearchNext();
			break;
		case EscapeSequence::HOME:
			return AcceptSearch(CTRL_A);
		case EscapeSequence::END:
			return AcceptSearch(CTRL_E);
		case EscapeSequence::LEFT:
			return AcceptSearch(CTRL_B);
		case EscapeSequence::RIGHT:
			return AcceptSearch(CTRL_F);
		default:
			break;
		}
		break;
	}
	case CTRL_A: // accept search, move to start of line
		return AcceptSearch(CTRL_A);
	case '\t':
	case CTRL_E: // accept search - move to end of line
		return AcceptSearch(CTRL_E);
	case CTRL_B: // accept search - move cursor left
		return AcceptSearch(CTRL_B);
	case CTRL_F: // accept search - move cursor right
		return AcceptSearch(CTRL_F);
	case CTRL_T: // accept search: swap character
		return AcceptSearch(CTRL_T);
	case CTRL_U: // accept search, clear buffer
		return AcceptSearch(CTRL_U);
	case CTRL_K: // accept search, clear after cursor
		return AcceptSearch(CTRL_K);
	case CTRL_D: // accept search, delete a character
		return AcceptSearch(CTRL_D);
	case CTRL_L:
		linenoiseClearScreen();
		break;
	case CTRL_P:
		SearchPrev();
		break;
	case CTRL_N:
		SearchNext();
		break;
	case CTRL_C:
	case CTRL_G:
		// abort search
		CancelSearch();
		return 0;
	case BACKSPACE: /* backspace */
	case CTRL_H:    /* ctrl-h */
	case CTRL_W:    /* ctrl-w */
		// remove trailing UTF-8 bytes (if any)
		while (!search_buf.empty() && ((search_buf.back() & 0xc0) == 0x80)) {
			search_buf.pop_back();
		}
		// finally remove the first UTF-8 byte
		if (!search_buf.empty()) {
			search_buf.pop_back();
		}
		PerformSearch();
		break;
	default:
		// add input to search buffer
		search_buf += c;
		// perform the search
		PerformSearch();
		break;
	}
	RefreshSearch();
	return 0;
}